

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

UniValue *
CreateUTXOSnapshot(UniValue *__return_storage_ptr__,NodeContext *node,Chainstate *chainstate,
                  AutoFile *afile,path *path,path *tmppath)

{
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> uStack_128;
  tuple<std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
  local_118;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_128,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
             ,0xbac,false);
  PrepareUTXOSnapshot(&local_118,chainstate,&node->rpc_interruption_point);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_128);
  WriteUTXOSnapshot(__return_storage_ptr__,chainstate,
                    (CCoinsViewCursor *)
                    local_118.
                    super__Tuple_impl<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
                    .
                    super__Head_base<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_false>
                    ._M_head_impl._M_t.
                    super___uniq_ptr_impl<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_CCoinsViewCursor_*,_std::default_delete<CCoinsViewCursor>_>
                    .super__Head_base<0UL,_CCoinsViewCursor_*,_false>._M_head_impl,
                    &local_118.
                     super__Tuple_impl<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
                     .super__Tuple_impl<1UL,_kernel::CCoinsStats,_const_CBlockIndex_*>.
                     super__Head_base<1UL,_kernel::CCoinsStats,_false>._M_head_impl,
                    (CBlockIndex *)
                    local_118.
                    super__Tuple_impl<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
                    .super__Tuple_impl<1UL,_kernel::CCoinsStats,_const_CBlockIndex_*>.
                    super__Tuple_impl<2UL,_const_CBlockIndex_*>.
                    super__Head_base<2UL,_const_CBlockIndex_*,_false>._M_head_impl,afile,path,
                    tmppath,&node->rpc_interruption_point);
  if (local_118.
      super__Tuple_impl<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
      .
      super__Head_base<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_false>
      ._M_head_impl._M_t.
      super___uniq_ptr_impl<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>._M_t.
      super__Tuple_impl<0UL,_CCoinsViewCursor_*,_std::default_delete<CCoinsViewCursor>_>.
      super__Head_base<0UL,_CCoinsViewCursor_*,_false>._M_head_impl !=
      (__uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true>)0x0) {
    (**(code **)(*(long *)local_118.
                          super__Tuple_impl<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_kernel::CCoinsStats,_const_CBlockIndex_*>
                          .
                          super__Head_base<0UL,_std::unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>,_false>
                          ._M_head_impl._M_t.
                          super___uniq_ptr_impl<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_CCoinsViewCursor_*,_std::default_delete<CCoinsViewCursor>_>
                          .super__Head_base<0UL,_CCoinsViewCursor_*,_false>._M_head_impl + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue CreateUTXOSnapshot(
    node::NodeContext& node,
    Chainstate& chainstate,
    AutoFile& afile,
    const fs::path& path,
    const fs::path& tmppath)
{
    auto [cursor, stats, tip]{WITH_LOCK(::cs_main, return PrepareUTXOSnapshot(chainstate, node.rpc_interruption_point))};
    return WriteUTXOSnapshot(chainstate, cursor.get(), &stats, tip, afile, path, tmppath, node.rpc_interruption_point);
}